

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_buffer_block_native(CompilerGLSL *this,SPIRVariable *var)

{
  __hashtable_alloc *p_Var1;
  uint uVar2;
  size_t sVar3;
  SPIRType *type;
  mapped_type *pmVar4;
  iterator iVar5;
  SPIRType *pSVar6;
  mapped_type *pmVar7;
  undefined8 *puVar8;
  char *pcVar9;
  TypedID<(spirv_cross::Types)0> *in_R9;
  __hashtable *__h;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *this_00;
  ulong uVar10;
  char *__end;
  char *pcVar11;
  long lVar12;
  CompilerGLSL *this_01;
  __node_gen_type __node_gen;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  SPIRVariable *local_120;
  TypedID<(spirv_cross::Types)1> *local_118;
  CompilerGLSL *local_110;
  ulong *local_108;
  string buffer_name;
  ulong *local_e0;
  long local_d8;
  ulong local_d0 [2];
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_c0;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_b8;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_b0;
  ulong *local_a8;
  long local_a0;
  ulong local_98 [2];
  char *local_88;
  char *local_80;
  char *local_78;
  Bitset flags;
  
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                    *(uint *)&(var->super_IVariant).field_0xc);
  ParsedIR::get_buffer_block_flags(&flags,&(this->super_Compiler).ir,var);
  if ((var->storage == StorageClassStorageBuffer) ||
     (var->storage == StorageClassShaderRecordBufferKHR)) {
LAB_001e2064:
    local_108 = (ulong *)0x36622f;
    if (((uint)flags.lower >> 0x17 & 1) == 0) {
      local_108 = (ulong *)0x35713a;
    }
    local_120 = (SPIRVariable *)0x37717e;
    if (((uint)flags.lower >> 0x13 & 1) == 0) {
      local_120 = (SPIRVariable *)0x35713a;
    }
    pcVar9 = "writeonly ";
    if (((uint)flags.lower >> 0x19 & 1) == 0) {
      pcVar9 = "";
    }
    pcVar11 = "readonly ";
    if (((uint)flags.lower >> 0x18 & 1) == 0) {
      pcVar11 = "";
    }
    local_118 = (TypedID<(spirv_cross::Types)1> *)
                CONCAT44(local_118._4_4_,(int)CONCAT71((uint7)(uint3)((uint)flags.lower >> 8),1));
  }
  else {
    pmVar4 = ::std::__detail::
             _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&(this->super_Compiler).ir.meta,&(type->super_IVariant).self);
    if (((pmVar4->decoration).decoration_flags.lower & 8) != 0) goto LAB_001e2064;
    pcVar11 = "";
    local_118 = (TypedID<(spirv_cross::Types)1> *)((ulong)local_118 & 0xffffffff00000000);
    local_120 = (SPIRVariable *)0x35713a;
    pcVar9 = "";
    local_108 = (ulong *)0x35713a;
  }
  (*(this->super_Compiler)._vptr_Compiler[6])
            (&buffer_name,this,(ulong)(type->super_IVariant).self.id,0);
  this_00 = &(this->block_ssbo_names)._M_h;
  if ((char)local_118 == '\0') {
    this_00 = &(this->block_ubo_names)._M_h;
  }
  local_b0 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)&(this->super_Compiler).ir.meta;
  pmVar4 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[](local_b0,&(type->super_IVariant).self);
  if ((((pmVar4->decoration).alias._M_string_length == 0) ||
      (iVar5 = ::std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::find(this_00,&buffer_name),
      iVar5.
      super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ._M_cur != (__node_type *)0x0)) ||
     (iVar5 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&(this->resource_names)._M_h,&buffer_name),
     iVar5.
     super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
     ._M_cur != (__node_type *)0x0)) {
    (*(this->super_Compiler)._vptr_Compiler[4])
              (&__node_gen,this,(ulong)(var->super_IVariant).self.id);
    ::std::__cxx11::string::_M_assign((string *)&buffer_name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__node_gen._M_h != &local_130) {
      operator_delete(__node_gen._M_h);
    }
  }
  local_b8 = &this->resource_names;
  add_variable(this,(unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_00,local_b8,&buffer_name);
  local_110 = this;
  if (buffer_name._M_string_length == 0) {
    pSVar6 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                        *(uint *)&(var->super_IVariant).field_0xc);
    join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&,char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>const&>
              ((string *)&__node_gen,(spirv_cross *)0x366a8c,
               (char (*) [2])&(pSVar6->super_IVariant).self,
               (TypedID<(spirv_cross::Types)0> *)0x366a8c,(char (*) [2])&(var->super_IVariant).self,
               in_R9);
    ::std::__cxx11::string::operator=((string *)&buffer_name,(string *)&__node_gen);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__node_gen._M_h != &local_130) {
      operator_delete(__node_gen._M_h);
    }
  }
  this_01 = local_110;
  __node_gen._M_h = (__hashtable_alloc *)&local_110->block_names;
  local_c0 = (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)__node_gen._M_h;
  ::std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)__node_gen._M_h,&buffer_name);
  __node_gen._M_h = (__hashtable_alloc *)this_00;
  ::std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)this_00,&buffer_name);
  __node_gen._M_h._0_4_ = (var->super_IVariant).self.id;
  pmVar7 = ::std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&(this_01->super_Compiler).declared_block_names,(key_type *)&__node_gen);
  ::std::__cxx11::string::_M_assign((string *)pmVar7);
  layout_for_variable_abi_cxx11_((string *)&__node_gen,this_01,var);
  local_a8 = local_108;
  local_e0 = (ulong *)local_120;
  local_88 = "uniform ";
  if ((char)local_118 != '\0') {
    local_88 = "buffer ";
  }
  local_80 = pcVar11;
  local_78 = pcVar9;
  statement<std::__cxx11::string,char_const*,char_const*,char_const*,char_const*,char_const*,std::__cxx11::string&>
            (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &__node_gen,(char **)&local_a8,(char **)&local_e0,&local_78,&local_80,&local_88
             ,&buffer_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__node_gen._M_h != &local_130) {
    operator_delete(__node_gen._M_h);
  }
  statement<char_const(&)[2]>(this_01,(char (*) [2])0x367845);
  this_01->indent = this_01->indent + 1;
  local_120 = var;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear(&(type->member_name_cache)._M_h);
  sVar3 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
          buffer_size;
  if (sVar3 != 0) {
    local_118 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                ptr;
    lVar12 = sVar3 << 2;
    uVar10 = 0;
    do {
      add_member_name(this_01,type,(uint32_t)uVar10);
      uVar2 = local_118[uVar10].id;
      __node_gen._M_h = (__hashtable_alloc *)&local_130;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&__node_gen,"","");
      (*(local_110->super_Compiler)._vptr_Compiler[0x15])
                (local_110,type,(ulong)uVar2,uVar10 & 0xffffffff,(string *)&__node_gen,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__node_gen._M_h != &local_130) {
        operator_delete(__node_gen._M_h);
      }
      uVar10 = uVar10 + 1;
      lVar12 = lVar12 + -4;
      this_01 = local_110;
    } while (lVar12 != 0);
  }
  preserve_alias_on_reset(this_01,(local_120->super_IVariant).self.id);
  __node_gen._M_h._0_4_ = (local_120->super_IVariant).self.id;
  pmVar4 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[](local_b0,(key_type *)&__node_gen);
  add_variable(this_01,local_b8,local_c0,(string *)pmVar4);
  (*(this_01->super_Compiler)._vptr_Compiler[6])
            (&local_a8,this_01,(ulong)(local_120->super_IVariant).self.id,1);
  (*(this_01->super_Compiler)._vptr_Compiler[0x26])(&local_e0,this_01,type);
  uVar10 = 0xf;
  if (local_a8 != local_98) {
    uVar10 = local_98[0];
  }
  if (uVar10 < (ulong)(local_d8 + local_a0)) {
    uVar10 = 0xf;
    if (local_e0 != local_d0) {
      uVar10 = local_d0[0];
    }
    if ((ulong)(local_d8 + local_a0) <= uVar10) {
      puVar8 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,(ulong)local_a8);
      goto LAB_001e2486;
    }
  }
  puVar8 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_e0);
LAB_001e2486:
  p_Var1 = (__hashtable_alloc *)(puVar8 + 2);
  if ((__hashtable_alloc *)*puVar8 == p_Var1) {
    local_130._M_allocated_capacity = *(undefined8 *)p_Var1;
    local_130._8_8_ = puVar8[3];
    __node_gen._M_h = (__hashtable_alloc *)&local_130;
  }
  else {
    local_130._M_allocated_capacity = *(undefined8 *)p_Var1;
    __node_gen._M_h = (__hashtable_alloc *)*puVar8;
  }
  *puVar8 = p_Var1;
  puVar8[1] = 0;
  *p_Var1 = (__hashtable_alloc)0x0;
  end_scope_decl(this_01,(string *)&__node_gen);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__node_gen._M_h != &local_130) {
    operator_delete(__node_gen._M_h);
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  statement<char_const(&)[1]>(this_01,(char (*) [1])0x35713a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)buffer_name._M_dataplus._M_p != &buffer_name.field_2) {
    operator_delete(buffer_name._M_dataplus._M_p);
  }
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&flags.higher._M_h);
  return;
}

Assistant:

void CompilerGLSL::emit_buffer_block_native(const SPIRVariable &var)
{
	auto &type = get<SPIRType>(var.basetype);

	Bitset flags = ir.get_buffer_block_flags(var);
	bool ssbo = var.storage == StorageClassStorageBuffer || var.storage == StorageClassShaderRecordBufferKHR ||
	            ir.meta[type.self].decoration.decoration_flags.get(DecorationBufferBlock);
	bool is_restrict = ssbo && flags.get(DecorationRestrict);
	bool is_writeonly = ssbo && flags.get(DecorationNonReadable);
	bool is_readonly = ssbo && flags.get(DecorationNonWritable);
	bool is_coherent = ssbo && flags.get(DecorationCoherent);

	// Block names should never alias, but from HLSL input they kind of can because block types are reused for UAVs ...
	auto buffer_name = to_name(type.self, false);

	auto &block_namespace = ssbo ? block_ssbo_names : block_ubo_names;

	// Shaders never use the block by interface name, so we don't
	// have to track this other than updating name caches.
	// If we have a collision for any reason, just fallback immediately.
	if (ir.meta[type.self].decoration.alias.empty() || block_namespace.find(buffer_name) != end(block_namespace) ||
	    resource_names.find(buffer_name) != end(resource_names))
	{
		buffer_name = get_block_fallback_name(var.self);
	}

	// Make sure we get something unique for both global name scope and block name scope.
	// See GLSL 4.5 spec: section 4.3.9 for details.
	add_variable(block_namespace, resource_names, buffer_name);

	// If for some reason buffer_name is an illegal name, make a final fallback to a workaround name.
	// This cannot conflict with anything else, so we're safe now.
	// We cannot reuse this fallback name in neither global scope (blocked by block_names) nor block name scope.
	if (buffer_name.empty())
		buffer_name = join("_", get<SPIRType>(var.basetype).self, "_", var.self);

	block_names.insert(buffer_name);
	block_namespace.insert(buffer_name);

	// Save for post-reflection later.
	declared_block_names[var.self] = buffer_name;

	statement(layout_for_variable(var), is_coherent ? "coherent " : "", is_restrict ? "restrict " : "",
	          is_writeonly ? "writeonly " : "", is_readonly ? "readonly " : "", ssbo ? "buffer " : "uniform ",
	          buffer_name);

	begin_scope();

	type.member_name_cache.clear();

	uint32_t i = 0;
	for (auto &member : type.member_types)
	{
		add_member_name(type, i);
		emit_struct_member(type, member, i);
		i++;
	}

	// var.self can be used as a backup name for the block name,
	// so we need to make sure we don't disturb the name here on a recompile.
	// It will need to be reset if we have to recompile.
	preserve_alias_on_reset(var.self);
	add_resource_name(var.self);
	end_scope_decl(to_name(var.self) + type_to_array_glsl(type));
	statement("");
}